

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnArrayType
          (BinaryReaderObjdump *this,Index index,TypeMut field)

{
  bool bVar1;
  string local_58;
  uint local_34;
  BinaryReaderObjdump *pBStack_30;
  Index index_local;
  BinaryReaderObjdump *this_local;
  Enum local_20;
  Type local_18;
  TypeMut field_local;
  
  this_local = (BinaryReaderObjdump *)field.type;
  local_20 = CONCAT31(local_20._1_3_,field.mutable_);
  field_local.type.enum_ = local_20;
  local_34 = index;
  pBStack_30 = this;
  local_18 = (Type)this_local;
  bVar1 = ShouldPrintDetails(this);
  if (bVar1) {
    printf(" - type[%u] (array",(ulong)local_34);
    if ((field_local.type.enum_ & ~I64) != Any) {
      printf(" (mut");
    }
    Type::GetName_abi_cxx11_(&local_58,&local_18);
    std::__cxx11::string::c_str();
    printf(" %s");
    std::__cxx11::string::~string((string *)&local_58);
    if ((field_local.type.enum_ & ~I64) != Any) {
      printf(")");
    }
    printf(")\n");
    Result::Result((Result *)&field_local.type.type_index_,Ok);
  }
  else {
    Result::Result((Result *)&field_local.type.type_index_,Ok);
  }
  return (Result)field_local.type.type_index_;
}

Assistant:

Result BinaryReaderObjdump::OnArrayType(Index index, TypeMut field) {
  if (!ShouldPrintDetails()) {
    return Result::Ok;
  }
  printf(" - type[%" PRIindex "] (array", index);
  if (field.mutable_) {
    printf(" (mut");
  }
  printf(" %s", field.type.GetName().c_str());
  if (field.mutable_) {
    printf(")");
  }
  printf(")\n");
  return Result::Ok;
}